

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O3

void __thiscall
FrobTadsApplicationCurses::scrollRegionDown
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  int y;
  FrobTadsWindow *this_00;
  chtype ch;
  int x;
  int i;
  
  if (top < bottom) {
    do {
      y = top + 1;
      x = left;
      if (left <= right) {
        do {
          this_00 = (this->fGameWindow)._M_t.
                    super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t
                    .super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                    super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl;
          ch = FrobTadsWindow::charAt(this_00,y,x);
          FrobTadsWindow::printChar(this_00,top,x,ch);
          x = x + 1;
        } while (right + 1 != x);
      }
      top = y;
    } while (y != bottom);
  }
  if (left <= right) {
    do {
      FrobTadsWindow::printChar
                ((this->fGameWindow)._M_t.
                 super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
                 super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                 super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,bottom,left,
                 attrs | 0x20);
      left = left + 1;
    } while (right + 1 != left);
  }
  if ((this->super_FrobTadsApplication).options.softScroll != false) {
    wrefresh(((_Head_base<0UL,__win_st_*,_false> *)
             ((long)&(((this->fGameWindow)._M_t.
                       super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>
                       .super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl)->fWin)._M_t + 8
             ))->_M_head_impl);
    return;
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::scrollRegionDown( int top, int left, int bottom, int right, int attrs )
{
    // This works like scrollRegionUp(), just the other way around.
    for (int y = top; y < bottom; ++y) {
        for (int x = left; x <= right; ++x) {
            this->fGameWindow->printChar(y, x, this->fGameWindow->charAt(y+1, x));
        }
    }
    const chtype c = attrs | ' ';
    for (int i = left; i <= right; ++i) this->fGameWindow->printChar(bottom, i, c);
    if (this->options.softScroll) this->fGameWindow->flush();
}